

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_knumint(jit_State *J,lua_Number n)

{
  int iVar1;
  TRef TVar2;
  undefined8 in_RDI;
  int32_t k_00;
  jit_State *in_XMM0_Qa;
  int32_t k;
  TValue tv;
  uint64_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  k_00 = (int32_t)((ulong)in_RDI >> 0x20);
  iVar1 = numistrueint((lua_Number)in_XMM0_Qa,(int32_t *)&stack0xffffffffffffffcc);
  if (iVar1 == 0) {
    TVar2 = lj_ir_knum_u64(in_XMM0_Qa,in_stack_ffffffffffffffc8);
  }
  else {
    TVar2 = lj_ir_kint((jit_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       k_00);
  }
  return TVar2;
}

Assistant:

TRef lj_ir_knumint(jit_State *J, lua_Number n)
{
  int32_t k;
  if (numistrueint(n, &k))
    return lj_ir_kint(J, k);
  else
    return lj_ir_knum(J, n);
}